

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O0

void __thiscall KalmanFilter::KalmanFilter(KalmanFilter *this)

{
  KalmanFilter *this_local;
  
  this->_vptr_KalmanFilter = (_func_int **)&PTR__KalmanFilter_00144d38;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->F_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Q_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->H_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_);
  return;
}

Assistant:

KalmanFilter::KalmanFilter() {}